

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbengine.cpp
# Opt level: O3

bool __thiscall banksia::WbEngine::engineMove(WbEngine *this,string *moveString,bool mustSend)

{
  GameTimeController *this_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
  moveRecv;
  EngineComputingState local_5c;
  Move local_58;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  double local_28;
  
  if (((moveString->_M_string_length < 2) ||
      (iVar1 = isalpha((int)*(moveString->_M_dataplus)._M_p), iVar1 == 0)) ||
     ((this->super_EngineProfile).super_Engine.computingState != thinking)) {
    return false;
  }
  this_00 = (this->super_EngineProfile).super_Engine.super_Player.timeController;
  std::
  function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
  ::function((function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
              *)&local_48,&(this->super_EngineProfile).super_Engine.super_Player.moveReceiver);
  if ((this_00 == (GameTimeController *)0x0) || (local_38 == (code *)0x0)) {
    bVar4 = false;
  }
  else {
    local_58 = BoardCore::moveFromCoordiateString(moveString);
    uVar2 = local_58.from;
    uVar3 = local_58.dest;
    if (uVar2 == uVar3 || 0x3f < (uVar3 | uVar2)) {
      local_58 = ChessBoard::fromSanString
                           ((this->super_EngineProfile).super_Engine.super_Player.board,moveString);
      uVar2 = local_58.from;
      uVar3 = local_58.dest;
    }
    if (!mustSend) {
      bVar4 = false;
      if ((uVar2 == uVar3) || (bVar4 = false, 0x3f < (uVar3 | uVar2))) goto LAB_0017bf4c;
    }
    local_28 = GameTimeController::moveTimeConsumed(this_00);
    local_5c = (this->super_EngineProfile).super_Engine.computingState;
    (this->super_EngineProfile).super_Engine.computingState = idle;
    if (local_38 == (code *)0x0) {
      std::__throw_bad_function_call();
    }
    (*local_30)(&local_48,&local_58,moveString,&Move::illegalMove,&local_28,&local_5c);
    bVar4 = true;
  }
LAB_0017bf4c:
  if (local_38 == (code *)0x0) {
    return bVar4;
  }
  (*local_38)(&local_48,&local_48,__destroy_functor);
  return bVar4;
}

Assistant:

bool WbEngine::engineMove(const std::string& moveString, bool mustSend)
{
    if (moveString.length() < 2 || !isalpha(moveString.at(0))
        || computingState != EngineComputingState::thinking) { // some engines don't orbey 'force' and create moves too fast -> ignore some cases
        return false;
    }
    
    auto timeCtrl = timeController;
    auto moveRecv = moveReceiver;
    if (timeCtrl == nullptr || moveRecv == nullptr) {
        return false;
    }
    
    auto move = board->moveFromCoordiateString(moveString);
    if (!move.isValid()) {
        move = board->fromSanString(moveString);
    }
    
    if (mustSend || move.isValid()) {
        auto period = timeCtrl->moveTimeConsumed(); // moveTimeConsumed();
        
        auto oldComputingState = computingState;
        computingState = EngineComputingState::idle;
        
        (moveRecv)(move, moveString, Move::illegalMove, period, oldComputingState);
        
        return true;
    }
    
    return false;
}